

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_20.cpp
# Opt level: O0

void __thiscall GLFlat::DrawLightsCompat(GLFlat *this,int pass)

{
  subsector_t *sub_00;
  byte *pbVar1;
  gl_subsectorrendernode *local_38;
  gl_subsectorrendernode *local_28;
  gl_subsectorrendernode *node;
  subsector_t *sub;
  int i;
  int pass_local;
  GLFlat *this_local;
  
  FRenderState::Apply(&gl_RenderState);
  for (sub._0_4_ = 0; (int)sub < this->sector->subsectorcount; sub._0_4_ = (int)sub + 1) {
    sub_00 = this->sector->subsectors[(int)sub];
    pbVar1 = TArray<unsigned_char,_unsigned_char>::operator[]
                       (&gl_drawinfo->ss_renderflags,((long)sub_00 - (long)subsectors) / 0x60);
    if ((*pbVar1 & this->renderflags) != 0) {
      DrawSubsectorLights(this,sub_00,pass);
    }
  }
  if ((this->renderflags & 4) == 0) {
    if ((this->renderflags & 1) == 0) {
      local_38 = FDrawInfo::GetOtherCeilingPlanes(gl_drawinfo,this->sector->sectornum);
    }
    else {
      local_38 = FDrawInfo::GetOtherFloorPlanes(gl_drawinfo,this->sector->sectornum);
    }
    for (local_28 = local_38; local_28 != (gl_subsectorrendernode *)0x0; local_28 = local_28->next)
    {
      DrawSubsectorLights(this,local_28->sub,pass);
    }
  }
  return;
}

Assistant:

void GLFlat::DrawLightsCompat(int pass)
{
	gl_RenderState.Apply();
	// Draw the subsectors belonging to this sector
	for (int i = 0; i<sector->subsectorcount; i++)
	{
		subsector_t * sub = sector->subsectors[i];
		if (gl_drawinfo->ss_renderflags[sub - subsectors] & renderflags)
		{
			DrawSubsectorLights(sub, pass);
		}
	}

	// Draw the subsectors assigned to it due to missing textures
	if (!(renderflags&SSRF_RENDER3DPLANES))
	{
		gl_subsectorrendernode * node = (renderflags&SSRF_RENDERFLOOR) ?
			gl_drawinfo->GetOtherFloorPlanes(sector->sectornum) :
			gl_drawinfo->GetOtherCeilingPlanes(sector->sectornum);

		while (node)
		{
			DrawSubsectorLights(node->sub, pass);
			node = node->next;
		}
	}
}